

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

int main(void)

{
  dsList *pdVar1;
  int *data;
  uint *puVar2;
  Item *item_1;
  dsListEntry *entry;
  Item *item;
  int i;
  dsList *items;
  dsCrate *crate;
  
  crate._4_4_ = 0;
  items = (dsList *)dsOpen("mycrate",1,1);
  pdVar1 = dsListAlloc();
  dsSetIndex(pdVar1,0x18);
  for (item._4_4_ = 0; item._4_4_ < 10; item._4_4_ = item._4_4_ + 1) {
    data = (int *)dsAlloc(4);
    *data = item._4_4_;
    dsListAdd(pdVar1,data);
  }
  dsSnapshot("mycrate-snapshot");
  dsClose((dsCrate **)&items);
  items = (dsList *)dsOpen("mycrate-snapshot",0,1);
  pdVar1 = (dsList *)dsGetIndex();
  for (item_1 = (Item *)dsListBegin(pdVar1); item_1 != (Item *)0x0;
      item_1 = (Item *)dsListNext((dsListEntry *)item_1)) {
    puVar2 = (uint *)dsListData((dsListEntry *)item_1);
    printf("  Item: %d\n",(ulong)*puVar2);
  }
  return 0;
}

Assistant:

int main()
{
	dsCrate *crate = dsOpen("mycrate", 1, 1);

	// Create a new dsList.
	dsList *items = dsListAlloc();

	// Set the list as the crate's index.
	dsSetIndex(items, sizeof(*items));

	// Add items to the list.
	int i;
	for (i = 0; i < 10; i++) {
		struct Item *item = dsAlloc(sizeof(*item));
		item->id = i;

		dsListAdd(items, item);
	}

	// Take a snapshot of the crate.
	dsSnapshot("mycrate-snapshot");

	// Close the crate.
	dsClose(&crate);


	// Open the snapshot.
	crate = dsOpen("mycrate-snapshot", 0, 1);

	// Get the crate's index.
	items = dsGetIndex();

	// Iterate over list.
	dsListEntry *entry;
	for (entry = dsListBegin(items); entry != NULL; entry = dsListNext(entry)) {
		struct Item *item = dsListData(entry);
		printf("  Item: %d\n", item->id);
	}

	return 0;
}